

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O0

void vdpu383_setup_down_scale(MppFrame frame,MppDev dev,Vdpu383CtrlReg *com,void *comParas)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  MppFrameFormat MVar3;
  MppFrameFormat MVar4;
  uint offset;
  MppMeta meta_00;
  size_t sVar5;
  uint local_60;
  uint local_5c;
  RK_U32 downscale_buf_size;
  RK_U32 down_scale_y_virstride;
  RK_U32 down_scale_uv_offset;
  RK_U32 down_scale_y_offset;
  MppMeta meta;
  MppFrameFormat fmt;
  Vdpu383RegCommParas *paras;
  RK_U32 down_scale_hor;
  RK_U32 down_scale_ver;
  RK_U32 down_scale_width;
  RK_U32 down_scale_height;
  void *comParas_local;
  Vdpu383CtrlReg *com_local;
  MppDev dev_local;
  MppFrame frame_local;
  
  RVar1 = mpp_frame_get_height(frame);
  RVar2 = mpp_frame_get_width(frame);
  paras._0_4_ = (RVar2 >> 1) + 0xf & 0xfffffff0;
  MVar3 = mpp_frame_get_fmt(frame);
  meta_00 = mpp_frame_get_meta(frame);
  local_5c = ((RVar1 >> 1) + 0xf & 0xfffffff0) * (uint)paras;
  MVar4 = mpp_frame_get_fmt(frame);
  if ((MVar4 & 0xf00000) == MPP_FMT_YUV420SP) {
    paras._0_4_ = mpp_align_128_odd_plus_64((uint)paras);
    RVar1 = mpp_frame_get_ver_stride(frame);
    local_5c = (RVar1 >> 1) * (uint)paras;
  }
  switch(MVar3 & 0xfffff) {
  case MPP_FMT_YUV420SP:
  case MPP_FMT_YUV420SP_10BIT:
    local_60 = local_5c * 3 >> 1;
    break;
  case MPP_FMT_YUV422SP:
  case MPP_FMT_YUV422SP_10BIT:
    local_60 = local_5c << 1;
    break;
  default:
    local_60 = local_5c * 3 >> 1;
    break;
  case MPP_FMT_YUV400:
    local_60 = local_5c;
    break;
  case MPP_FMT_YUV444SP:
    local_60 = local_5c * 3;
  }
  sVar5 = mpp_frame_get_buf_size(frame);
  offset = ((int)sVar5 - (local_60 + 0xf & 0xfffffff0)) + 0xf & 0xfffffff0;
  com->reg9 = (SWREG9_IMPORTANT_EN)((uint)com->reg9 & 0xffffffdf | 0x20);
  com->reg9 = (SWREG9_IMPORTANT_EN)((uint)com->reg9 & 0xfffffeff);
  *(uint *)((long)comParas + 0x1c) = (uint)paras >> 4;
  *(uint *)((long)comParas + 0x20) = (uint)paras >> 4;
  if ((MVar3 & 0xfffff) == MPP_FMT_YUV444SP) {
    *(uint *)((long)comParas + 0x20) = (uint)paras >> 3;
  }
  *(uint *)((long)comParas + 0x24) = local_5c >> 4;
  RVar1 = mpp_frame_get_thumbnail_en(frame);
  if (RVar1 == 1) {
    mpp_dev_set_reg_offset(dev,0x85,offset);
    mpp_meta_set_s32(meta_00,KEY_DEC_TBN_Y_OFFSET,offset);
    mpp_meta_set_s32(meta_00,KEY_DEC_TBN_UV_OFFSET,offset + local_5c);
  }
  return;
}

Assistant:

void vdpu383_setup_down_scale(MppFrame frame, MppDev dev, Vdpu383CtrlReg *com, void* comParas)
{
    RK_U32 down_scale_height = mpp_frame_get_height(frame) >> 1;
    RK_U32 down_scale_width = mpp_frame_get_width(frame) >> 1;
    RK_U32 down_scale_ver = MPP_ALIGN(down_scale_height, 16);
    RK_U32 down_scale_hor = MPP_ALIGN(down_scale_width, 16);

    Vdpu383RegCommParas* paras = (Vdpu383RegCommParas*)comParas;
    MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppMeta meta = mpp_frame_get_meta(frame);
    RK_U32 down_scale_y_offset = 0;
    RK_U32 down_scale_uv_offset = 0;
    RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;
    RK_U32 downscale_buf_size;

    if (!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(frame))) {
        down_scale_hor = mpp_align_128_odd_plus_64(down_scale_hor);
        down_scale_ver = mpp_frame_get_ver_stride(frame) >> 1;
        down_scale_y_virstride = down_scale_ver * down_scale_hor;
    }
    /*
     *  no matter what format, scale down image will output as 8bit raster format;
     *  down_scale image buffer size was already added to the buf_size of mpp_frame,
     *  which was calculated in mpp_buf_slot.cpp: (size = original_size + scaledown_size)
     */
    switch ((fmt & MPP_FRAME_FMT_MASK)) {
    case MPP_FMT_YUV400 : {
        downscale_buf_size = down_scale_y_virstride;
    } break;
    case MPP_FMT_YUV420SP_10BIT :
    case MPP_FMT_YUV420SP : {
        downscale_buf_size = down_scale_y_virstride * 3 / 2;
    } break;
    case MPP_FMT_YUV422SP_10BIT :
    case MPP_FMT_YUV422SP : {
        downscale_buf_size = down_scale_y_virstride * 2;
    } break;
    case MPP_FMT_YUV444SP : {
        downscale_buf_size = down_scale_y_virstride * 3;
    } break;
    default : {
        downscale_buf_size = down_scale_y_virstride * 3 / 2;
    } break;
    }
    downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);

    down_scale_y_offset = MPP_ALIGN((mpp_frame_get_buf_size(frame) - downscale_buf_size), 16);
    down_scale_uv_offset = down_scale_y_offset + down_scale_y_virstride;

    com->reg9.scale_down_en = 1;
    com->reg9.av1_fgs_en = 0;
    paras->reg71_scl_ref_hor_virstride = down_scale_hor >> 4;
    paras->reg72_scl_ref_raster_uv_hor_virstride = down_scale_hor >> 4;
    if ((fmt & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV444SP)
        paras->reg72_scl_ref_raster_uv_hor_virstride = down_scale_hor >> 3;
    paras->reg73_scl_ref_virstride = down_scale_y_virstride >> 4;
    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        mpp_dev_set_reg_offset(dev, 133, down_scale_y_offset);
        mpp_meta_set_s32(meta, KEY_DEC_TBN_Y_OFFSET, down_scale_y_offset);
        mpp_meta_set_s32(meta, KEY_DEC_TBN_UV_OFFSET, down_scale_uv_offset);
    }
}